

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O1

void anon_unknown.dwarf_2f4f9b::check<int>(istream *is,int c)

{
  undefined8 in_RAX;
  size_t sVar1;
  ostream *this;
  long *plVar2;
  char *__s;
  char b [4];
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  std::istream::read((char *)is,(long)&local_24);
  __s = _put + (*_put == '*');
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": expected ",0xb);
  this = (ostream *)std::ostream::operator<<(&std::cout,c);
  std::__ostream_insert<char,std::char_traits<char>>(this,", got ",6);
  plVar2 = (long *)std::ostream::operator<<(this,local_24);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (local_24 == c) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testXdr.cpp"
                ,0x85,"void (anonymous namespace)::check(istream &, T) [T = int]");
}

Assistant:

void
check (istream &is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid(v).name() << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}